

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

bool idx2::ToDouble(stref *Str,f64 *Result)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  double dVar5;
  char *pcStack_30;
  bool Failure;
  char *EndPtr;
  f64 *Result_local;
  stref *Str_local;
  stref *local_10;
  
  if (((Str->field_0).Ptr == (str)0x0) || (Str->Size < 1)) {
    Str_local._7_1_ = false;
  }
  else {
    pcStack_30 = (char *)0x0;
    EndPtr = (char *)Result;
    Result_local = (f64 *)Str;
    local_10 = Str;
    dVar5 = strtod((Str->field_0).Ptr,&stack0xffffffffffffffd0);
    *(double *)EndPtr = dVar5;
    piVar3 = __errno_location();
    bVar1 = 1;
    if ((*piVar3 != 0x22) &&
       ((bVar1 = 1, pcStack_30 != (char *)*Result_local && (bVar1 = 1, pcStack_30 != (char *)0x0))))
    {
      iVar2 = isspace((int)*pcStack_30);
      bVar4 = true;
      if (iVar2 == 0) {
        iVar2 = ispunct((int)*pcStack_30);
        bVar4 = true;
        if (iVar2 == 0) {
          bVar4 = *pcStack_30 == '\0';
        }
      }
      bVar1 = bVar4 ^ 1;
    }
    Str_local._7_1_ = (bool)(bVar1 ^ 1);
  }
  return Str_local._7_1_;
}

Assistant:

bool
ToDouble(const stref& Str, f64* Result)
{
  if (!Str || Str.Size <= 0)
    return false;
  char* EndPtr = nullptr;
  *Result = strtod(Str.ConstPtr, &EndPtr);
  bool Failure = errno == ERANGE || EndPtr == Str.ConstPtr || !EndPtr ||
                 !(isspace(*EndPtr) || ispunct(*EndPtr) || (*EndPtr) == 0);
  return !Failure;
}